

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int setbfe(match *res,bitfield *bf,expr *expr)

{
  uint uVar1;
  ulong uVar2;
  ull *a;
  ull uVar3;
  expr *in_RDX;
  bitfield *in_RSI;
  match *in_RDI;
  ull totalsz;
  ull mask;
  int j;
  int max;
  ull num;
  disctx *ctx;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  uint local_4;
  
  if (in_RDX->isimm == 0) {
    local_4 = 0;
  }
  else if ((in_RDX->type == EXPR_NUM) && (in_RSI->pcrel == 0)) {
    uVar2 = in_RDX->num1 - in_RSI->addend ^ in_RSI->xorend;
    if (in_RSI->lut != (ull *)0x0) {
      in_stack_ffffffffffffffd4 = 1 << ((char)in_RSI->sbf[0].len + (char)in_RSI->sbf[1].len & 0x1fU)
      ;
      for (in_stack_ffffffffffffffd0 = 0;
          (in_stack_ffffffffffffffd0 < in_stack_ffffffffffffffd4 &&
          (in_RSI->lut[in_stack_ffffffffffffffd0] != uVar2));
          in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffd0 + 1) {
      }
      if (in_stack_ffffffffffffffd0 == in_stack_ffffffffffffffd4) {
        return 0;
      }
      uVar2 = (ulong)in_stack_ffffffffffffffd0;
    }
    uVar2 = uVar2 >> ((byte)in_RSI->shr & 0x3f);
    setsbf(in_RDI,in_RSI->sbf[0].pos,in_RSI->sbf[0].len,uVar2);
    a = (ull *)(uVar2 >> ((byte)in_RSI->sbf[0].len & 0x3f));
    setsbf(in_RDI,in_RSI->sbf[1].pos,in_RSI->sbf[1].len,(ull)a);
    ctx = (disctx *)0xffffffffffffffff;
    uVar1 = in_RSI->shr + in_RSI->sbf[0].len + in_RSI->sbf[1].len;
    if ((in_RSI->wrapok != 0) && (uVar1 < 0x40)) {
      ctx = (disctx *)((1L << ((byte)uVar1 & 0x3f)) + -1);
    }
    uVar3 = getbf((bitfield *)in_RDX,a,
                  (ull *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),ctx);
    local_4 = (uint)((uVar3 & (ulong)ctx) == (in_RDX->num1 & (ulong)ctx));
  }
  else {
    if (in_RDI->nrelocs == 8) {
      __assert_fail("res->nrelocs != 8",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/polachok[P]envytools/envydis/core.c"
                    ,299,"int setbfe(struct match *, const struct bitfield *, const struct expr *)")
      ;
    }
    in_RDI->relocs[in_RDI->nrelocs].bf = in_RSI;
    in_RDI->relocs[in_RDI->nrelocs].expr = in_RDX;
    in_RDI->nrelocs = in_RDI->nrelocs + 1;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int setbfe (struct match *res, const struct bitfield *bf, const struct expr *expr) {
	if (!expr->isimm)
		return 0;
	if (expr->type != EXPR_NUM || bf->pcrel) {
		assert (res->nrelocs != 8);
		res->relocs[res->nrelocs].bf = bf;
		res->relocs[res->nrelocs].expr = expr;
		res->nrelocs++;
		return 1;
	}
	ull num = (expr->num1 - bf->addend) ^ bf->xorend;
	if (bf->lut) {
		int max = 1 << (bf->sbf[0].len + bf->sbf[1].len);
		int j = 0;
		for (j = 0; j < max; j++)
			if (bf->lut[j] == num)
				break;
		if (j == max)
			return 0;
		num = j;
	}
	num >>= bf->shr;
	setsbf(res, bf->sbf[0].pos, bf->sbf[0].len, num);
	num >>= bf->sbf[0].len;
	setsbf(res, bf->sbf[1].pos, bf->sbf[1].len, num);
	ull mask = ~0ull;
	ull totalsz = bf->shr + bf->sbf[0].len + bf->sbf[1].len;
	if (bf->wrapok && totalsz < 64)
		mask = (1ull << totalsz) - 1;
	return (getbf(bf, res->a, res->m, 0) & mask) == (expr->num1 & mask);
}